

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

BOOL LOADValidateModule(MODSTRUCT *module)

{
  MODSTRUCT *pMVar1;
  
  pMVar1 = &exe_module;
  do {
    if (pMVar1 == module) {
      if ((MODSTRUCT *)module->self == module) {
        if (PAL_InitializeChakraCoreCalled) {
          return 1;
        }
        goto LAB_001ce09f;
      }
      break;
    }
    pMVar1 = pMVar1->next;
  } while (pMVar1 != &exe_module);
  if (PAL_InitializeChakraCoreCalled) {
    return 0;
  }
LAB_001ce09f:
  abort();
}

Assistant:

static BOOL LOADValidateModule(MODSTRUCT *module)
{
    MODSTRUCT *modlist_enum = &exe_module;

    /* enumerate through the list of modules to make sure the given handle is
       really a module (HMODULEs are actually MODSTRUCT pointers) */
    do
    {
        if (module == modlist_enum)
        {
            /* found it; check its integrity to be on the safe side */
            if (module->self != module)
            {
                ERROR("Found corrupt module %p!\n",module);
                return FALSE;
            }
            TRACE("Module %p is valid (name : %S)\n", module, MODNAME(module));
            return TRUE;
        }
        modlist_enum = modlist_enum->next;
    }
    while (modlist_enum != &exe_module);

    TRACE("Module %p is NOT valid.\n", module);
    return FALSE;
}